

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHandTrackerDevice.cpp
# Opt level: O2

void __thiscall
MinVR::VRFakeHandTrackerDevice::onVREvent(VRFakeHandTrackerDevice *this,VRDataIndex *event)

{
  string *psVar1;
  __type _Var2;
  bool bVar3;
  VRAnyCoreType VVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  VRFloatArray screenPos;
  _Vector_base<float,_std::allocator<float>_> local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  VRDataIndex di;
  VRVector3 pos;
  VRMatrix4 xform;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  VRMatrix4 local_108;
  VRDataIndex local_c0;
  
  psVar1 = &event->_indexName;
  std::__cxx11::string::string((string *)&di,(string *)psVar1);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&di,
                          &this->_toggleEvent);
  std::__cxx11::string::~string((string *)&di);
  if (_Var2) {
    bVar3 = this->_tracking;
    this->_tracking = (bool)(bVar3 ^ 1);
    if (bVar3 != false) {
      return;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_128,(string *)psVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_378,&this->_zKeys);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"Down",(allocator<char> *)&di);
    bVar3 = eventMatch(&local_128,&local_378,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_378);
    std::__cxx11::string::~string((string *)&local_128);
    if (bVar3) {
      this->_state = ZTranslating;
      return;
    }
    std::__cxx11::string::string((string *)&local_168,(string *)psVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_390,&this->_zKeys);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"Up",(allocator<char> *)&di);
    bVar3 = eventMatch(&local_168,&local_390,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_390);
    std::__cxx11::string::~string((string *)&local_168);
    if (!bVar3) {
      std::__cxx11::string::string((string *)&local_1a8,(string *)psVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3a8,&this->_rotKeys);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"Down",(allocator<char> *)&di);
      bVar3 = eventMatch(&local_1a8,&local_3a8,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      if (bVar3) {
        this->_state = Rotating;
        return;
      }
      std::__cxx11::string::string((string *)&local_1e8,(string *)psVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3c0,&this->_rotKeys);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Up",(allocator<char> *)&di);
      bVar3 = eventMatch(&local_1e8,&local_3c0,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3c0);
      std::__cxx11::string::~string((string *)&local_1e8);
      if (!bVar3) {
        std::__cxx11::string::string((string *)&di,(string *)psVar1);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&di,"Mouse_Move");
        std::__cxx11::string::~string((string *)&di);
        if (!bVar3) {
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&di,"NormalizedPosition",(allocator<char> *)&xform);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"",(allocator<char> *)&pos);
        VVar4 = VRDataIndex::getValue(event,(string *)&di,&local_228,true);
        (*(VVar4.datum)->_vptr_VRDatum[0xd])(&screenPos,VVar4.datum);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&di);
        if (4 < (ulong)((long)screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start)) {
          fVar7 = (1.0 - screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[1]) + -0.5;
          fVar6 = *screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + -0.5 +
                  *screenPos.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + -0.5;
          fVar7 = fVar7 + fVar7;
          if (this->_tracking == true) {
            fVar5 = fVar7 - this->_lastMouseY;
            if (this->_state == Rotating) {
              VRMatrix4::rotationY((VRMatrix4 *)&pos,(fVar6 - this->_lastMouseX) * this->_rScale);
              VRMatrix4::rotationX(&local_108,fVar5 * -this->_rScale);
              operator*(&xform,(VRMatrix4 *)&pos,&local_108);
              operator*((VRMatrix4 *)&di,&xform,&this->_R);
              VRMatrix4::operator=(&this->_R,(VRMatrix4 *)&di);
              VRMatrix4::~VRMatrix4((VRMatrix4 *)&di);
              VRMatrix4::~VRMatrix4(&xform);
              VRMatrix4::~VRMatrix4(&local_108);
              VRMatrix4::~VRMatrix4((VRMatrix4 *)&pos);
            }
            else if (this->_state == ZTranslating) {
              this->_z = fVar5 * this->_zScale + this->_z;
            }
            VRVector3::VRVector3(&pos,fVar6 * this->_xyScale,fVar7 * this->_xyScale,this->_z);
            VRMatrix4::translation((VRMatrix4 *)&di,&pos);
            operator*(&xform,(VRMatrix4 *)&di,&this->_R);
            VRMatrix4::~VRMatrix4((VRMatrix4 *)&di);
            VRMatrix4::toVRFloatArray((VRFloatArray *)&local_3d8,&xform);
            VRTrackerEvent::createValidDataIndex
                      (&di,&this->_eventName,(vector<float,_std::allocator<float>_> *)&local_3d8);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_3d8);
            VRDataIndex::VRDataIndex(&local_c0,&di);
            VRDataQueue::push(&this->_pendingEvents,&local_c0);
            VRDataIndex::~VRDataIndex(&local_c0);
            VRDataIndex::~VRDataIndex(&di);
            VRMatrix4::~VRMatrix4(&xform);
            VRVector3::~VRVector3(&pos);
          }
          this->_lastMouseX = fVar6;
          this->_lastMouseY = fVar7;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&screenPos.super__Vector_base<float,_std::allocator<float>_>);
        return;
      }
    }
  }
  this->_state = XYTranslating;
  return;
}

Assistant:

void VRFakeHandTrackerDevice::onVREvent(const VRDataIndex &event)
{
    if (event.getName() == _toggleEvent) {
        _tracking = !_tracking;
        if (_tracking) {
            _state = VRFakeHandTrackerDevice::XYTranslating;
        }
    }
    else if (eventMatch(event.getName(), _zKeys, "Down")) {
        _state = VRFakeHandTrackerDevice::ZTranslating;
    }
    else if (eventMatch(event.getName(), _zKeys, "Up")) {
        _state = VRFakeHandTrackerDevice::XYTranslating;
    }
    else if (eventMatch(event.getName(), _rotKeys, "Down")) {
        _state = VRFakeHandTrackerDevice::Rotating;
    }
    else if (eventMatch(event.getName(), _rotKeys, "Up")) {
        _state = VRFakeHandTrackerDevice::XYTranslating;
    }
    else if (event.getName() == "Mouse_Move") {
        VRFloatArray screenPos = event.getValue("NormalizedPosition");
        if (screenPos.size() >= 2) {
            float mousex = 2.0f*(screenPos[0] - 0.5f);
            float mousey = 2.0f*((1.0f-screenPos[1]) - 0.5f);

            if (_tracking) {
                float deltaX = mousex - _lastMouseX;
                float deltaY = mousey - _lastMouseY;
            
                if (_state == VRFakeHandTrackerDevice::ZTranslating) {
                    _z += _zScale * deltaY;
                }
                else if (_state == VRFakeHandTrackerDevice::Rotating) {
                    _R = VRMatrix4::rotationY(_rScale*deltaX) * VRMatrix4::rotationX(-_rScale*deltaY) * _R;
                }
            
                VRVector3 pos = VRVector3(_xyScale * mousex, _xyScale * mousey, _z);
                VRMatrix4 xform  = VRMatrix4::translation(pos) * _R;

                VRDataIndex di = VRTrackerEvent::createValidDataIndex(_eventName, xform.toVRFloatArray());
                _pendingEvents.push(di);
            }
            
            _lastMouseX = mousex;
            _lastMouseY = mousey;
        }
    }
}